

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

void __thiscall RegVmLoweredFunction::FreeConstantRegisters(RegVmLoweredFunction *this)

{
  uchar *puVar1;
  uint i;
  uint index;
  
  for (index = 0; index < (this->constantRegisters).count; index = index + 1) {
    puVar1 = SmallArray<unsigned_char,_16U>::operator[](&this->constantRegisters,index);
    FreeRegister(this,*puVar1);
  }
  (this->constantRegisters).count = 0;
  return;
}

Assistant:

void RegVmLoweredFunction::FreeConstantRegisters()
{
	for(unsigned i = 0; i < constantRegisters.size(); i++)
		FreeRegister(constantRegisters[i]);

	constantRegisters.clear();
}